

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_hw.c
# Opt level: O0

int cipher_hw_aes_initkey(PROV_CIPHER_CTX *dat,uchar *key,size_t keylen)

{
  int line;
  AES_KEY *key_00;
  code *pcVar1;
  char *in_RDX;
  uchar *in_RSI;
  char *in_RDI;
  bool bVar2;
  AES_KEY *ks;
  PROV_AES_CTX *adat;
  int ret;
  char *pcVar3;
  uint local_4;
  
  key_00 = (AES_KEY *)(in_RDI + 0xc0);
  *(AES_KEY **)(in_RDI + 0xb0) = key_00;
  pcVar3 = in_RDI;
  if (((*(int *)(in_RDI + 0x10) == 1) || (*(int *)(in_RDI + 0x10) == 2)) &&
     (((byte)in_RDI[0x3c] >> 1 & 1) == 0)) {
    if (((DAT_005e9d1c & 0x200) == 0) || (*(int *)(in_RDI + 0x10) != 2)) {
      if ((DAT_005e9d1c & 0x200) == 0) {
        line = AES_set_decrypt_key(in_RSI,(int)((long)in_RDX << 3),key_00);
        *(code **)in_RDI = AES_decrypt;
        pcVar1 = (code *)0x0;
        if (*(int *)(in_RDI + 0x10) == 2) {
          pcVar1 = AES_cbc_encrypt;
        }
        *(code **)(in_RDI + 8) = pcVar1;
      }
      else {
        line = vpaes_set_decrypt_key(in_RSI,((ulong)in_RDX & 0x1fffffff) << 3,key_00);
        *(code **)in_RDI = vpaes_decrypt;
        pcVar1 = (code *)0x0;
        if (*(int *)(in_RDI + 0x10) == 2) {
          pcVar1 = vpaes_cbc_encrypt;
        }
        *(code **)(in_RDI + 8) = pcVar1;
      }
    }
    else {
      line = AES_set_decrypt_key(in_RSI,(int)((long)in_RDX << 3),key_00);
      *(code **)in_RDI = AES_decrypt;
      *(code **)(in_RDI + 8) = ossl_bsaes_cbc_encrypt;
    }
  }
  else if (((DAT_005e9d1c & 0x200) == 0) || (*(int *)(in_RDI + 0x10) != 5)) {
    if ((DAT_005e9d1c & 0x200) == 0) {
      line = AES_set_encrypt_key(in_RSI,(int)((long)in_RDX << 3),key_00);
      *(code **)in_RDI = AES_encrypt;
      pcVar1 = (code *)0x0;
      if (*(int *)(in_RDI + 0x10) == 2) {
        pcVar1 = AES_cbc_encrypt;
      }
      *(code **)(in_RDI + 8) = pcVar1;
    }
    else {
      line = vpaes_set_encrypt_key(in_RSI,((ulong)in_RDX & 0x1fffffff) << 3,key_00);
      *(code **)in_RDI = vpaes_encrypt;
      pcVar1 = (code *)0x0;
      if (*(int *)(in_RDI + 0x10) == 2) {
        pcVar1 = vpaes_cbc_encrypt;
      }
      *(code **)(in_RDI + 8) = pcVar1;
    }
  }
  else {
    line = AES_set_encrypt_key(in_RSI,(int)((long)in_RDX << 3),key_00);
    *(code **)in_RDI = AES_encrypt;
    *(code **)(in_RDI + 8) = ossl_bsaes_ctr32_encrypt_blocks;
  }
  bVar2 = -1 < line;
  if (!bVar2) {
    ERR_new();
    ERR_set_debug(in_RDX,line,pcVar3);
    ERR_set_error(0x39,0x65,(char *)0x0);
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

static int cipher_hw_aes_initkey(PROV_CIPHER_CTX *dat,
                                 const unsigned char *key, size_t keylen)
{
    int ret;
    PROV_AES_CTX *adat = (PROV_AES_CTX *)dat;
    AES_KEY *ks = &adat->ks.ks;

    dat->ks = ks;

    if ((dat->mode == EVP_CIPH_ECB_MODE || dat->mode == EVP_CIPH_CBC_MODE)
        && !dat->enc) {
#ifdef HWAES_CAPABLE
        if (HWAES_CAPABLE) {
            ret = HWAES_set_decrypt_key(key, keylen * 8, ks);
            dat->block = (block128_f)HWAES_decrypt;
            dat->stream.cbc = NULL;
# ifdef HWAES_cbc_encrypt
            if (dat->mode == EVP_CIPH_CBC_MODE)
                dat->stream.cbc = (cbc128_f)HWAES_cbc_encrypt;
# endif
# ifdef HWAES_ecb_encrypt
            if (dat->mode == EVP_CIPH_ECB_MODE)
                dat->stream.ecb = (ecb128_f)HWAES_ecb_encrypt;
# endif
        } else
#endif
#ifdef BSAES_CAPABLE
        if (BSAES_CAPABLE && dat->mode == EVP_CIPH_CBC_MODE) {
            ret = AES_set_decrypt_key(key, keylen * 8, ks);
            dat->block = (block128_f)AES_decrypt;
            dat->stream.cbc = (cbc128_f)ossl_bsaes_cbc_encrypt;
        } else
#endif
#ifdef VPAES_CAPABLE
        if (VPAES_CAPABLE) {
            ret = vpaes_set_decrypt_key(key, keylen * 8, ks);
            dat->block = (block128_f)vpaes_decrypt;
            dat->stream.cbc = (dat->mode == EVP_CIPH_CBC_MODE)
                              ?(cbc128_f)vpaes_cbc_encrypt : NULL;
        } else
#endif
        {
            ret = AES_set_decrypt_key(key, keylen * 8, ks);
            dat->block = (block128_f)AES_decrypt;
            dat->stream.cbc = (dat->mode == EVP_CIPH_CBC_MODE)
                              ? (cbc128_f)AES_cbc_encrypt : NULL;
        }
    } else
#ifdef HWAES_CAPABLE
    if (HWAES_CAPABLE) {
        ret = HWAES_set_encrypt_key(key, keylen * 8, ks);
        dat->block = (block128_f)HWAES_encrypt;
        dat->stream.cbc = NULL;
# ifdef HWAES_cbc_encrypt
        if (dat->mode == EVP_CIPH_CBC_MODE)
            dat->stream.cbc = (cbc128_f)HWAES_cbc_encrypt;
        else
# endif
# ifdef HWAES_ecb_encrypt
        if (dat->mode == EVP_CIPH_ECB_MODE)
            dat->stream.ecb = (ecb128_f)HWAES_ecb_encrypt;
        else
# endif
# ifdef HWAES_ctr32_encrypt_blocks
        if (dat->mode == EVP_CIPH_CTR_MODE)
            dat->stream.ctr = (ctr128_f)HWAES_ctr32_encrypt_blocks;
        else
# endif
            (void)0;            /* terminate potentially open 'else' */
    } else
#endif
#ifdef BSAES_CAPABLE
    if (BSAES_CAPABLE && dat->mode == EVP_CIPH_CTR_MODE) {
        ret = AES_set_encrypt_key(key, keylen * 8, ks);
        dat->block = (block128_f)AES_encrypt;
        dat->stream.ctr = (ctr128_f)ossl_bsaes_ctr32_encrypt_blocks;
    } else
#endif
#ifdef VPAES_CAPABLE
    if (VPAES_CAPABLE) {
        ret = vpaes_set_encrypt_key(key, keylen * 8, ks);
        dat->block = (block128_f)vpaes_encrypt;
        dat->stream.cbc = (dat->mode == EVP_CIPH_CBC_MODE)
                          ? (cbc128_f)vpaes_cbc_encrypt : NULL;
    } else
#endif
    {
        ret = AES_set_encrypt_key(key, keylen * 8, ks);
        dat->block = (block128_f)AES_encrypt;
        dat->stream.cbc = (dat->mode == EVP_CIPH_CBC_MODE)
                          ? (cbc128_f)AES_cbc_encrypt : NULL;
#ifdef AES_CTR_ASM
        if (dat->mode == EVP_CIPH_CTR_MODE)
            dat->stream.ctr = (ctr128_f)AES_ctr32_encrypt;
#endif
    }

    if (ret < 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_KEY_SETUP_FAILED);
        return 0;
    }

    return 1;
}